

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

BYTE * __thiscall FBackdropTexture::GetColumn(FBackdropTexture *this,uint column,Span **spans_out)

{
  uint uVar1;
  
  if (this->LastRenderTic != gametic) {
    Render(this);
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpan;
  }
  uVar1 = 0x8f;
  if (column < 0x8f) {
    uVar1 = column;
  }
  return this->Pixels + uVar1 * 0xa0;
}

Assistant:

const BYTE *FBackdropTexture::GetColumn(unsigned int column, const Span **spans_out)
{
	if (LastRenderTic != gametic)
	{
		Render();
	}
	column = clamp(column, 0u, 143u);
	if (spans_out != NULL)
	{
		*spans_out = DummySpan;
	}
	return Pixels + column*160;
}